

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

_Bool duckdb_je_tsd_tcache_enabled_data_init(tsd_t *tsd)

{
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled = duckdb_je_opt_tcache;
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).tcache_nbins =
       duckdb_je_global_do_not_change_tcache_nbins;
  duckdb_je_tsd_slow_update(tsd);
  if (duckdb_je_opt_tcache == true) {
    duckdb_je_tsd_tcache_data_init(tsd,(arena_t *)0x0,opt_tcache_ncached_max);
  }
  return false;
}

Assistant:

bool
tsd_tcache_enabled_data_init(tsd_t *tsd) {
	/* Called upon tsd initialization. */
	tsd_tcache_enabled_set(tsd, opt_tcache);
	/*
	 * tcache is not available yet, but we need to set up its tcache_nbins
	 * in advance.
	 */
	tcache_default_settings_init(tsd_tcache_slowp_get(tsd));
	tsd_slow_update(tsd);

	if (opt_tcache) {
		/* Trigger tcache init. */
		tsd_tcache_data_init(tsd, NULL,
		    tcache_get_default_ncached_max());
	}

	return false;
}